

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_filter.cpp
# Opt level: O3

void __thiscall tst_helpers_filter::filterValues(tst_helpers_filter *this)

{
  QSharedData *pQVar1;
  QArrayData *pQVar2;
  PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)> *pPVar3;
  bool bVar4;
  long *plVar5;
  PromiseData<QList<int>_> *pPVar6;
  const_iterator expectedBegin;
  QPromiseReject<QList<int>_> *reject;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<bool>::Data> QVar7;
  long lVar8;
  PromiseResolver<QList<int>_> resolver_1;
  bool local_111;
  QArrayData *local_110;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> local_108;
  QPromise<QList<int>_> p;
  QArrayData *local_f0;
  QArrayData *d;
  const_iterator cStack_e0;
  QArrayData *local_d8;
  undefined8 *local_d0;
  undefined8 local_c8;
  PromiseResolver<bool> resolver;
  QArrayData *d_1;
  PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)> *local_90;
  function<void_(const_QList<bool>_&)> local_88;
  function<void_(const_QtPromisePrivate::PromiseError_&)> local_68;
  undefined8 *local_48;
  undefined **local_38;
  
  reject = (QPromiseReject<QList<int>_> *)0x1;
  local_48 = (undefined8 *)QArrayData::allocate(&d,4,8,3,KeepSize);
  local_110 = d;
  *local_48 = 0x2b0000002a;
  *(undefined4 *)(local_48 + 1) = 0x2c;
  d = (QArrayData *)0x0;
  cStack_e0.i = (int *)0x0;
  local_d8 = (QArrayData *)0x0;
  lVar8 = 0;
  local_38 = &PTR__PromiseDataBase_001355f8;
  do {
    local_68.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_00135560;
    plVar5 = (long *)operator_new(0x68);
    *plVar5 = 0;
    plVar5[1] = 0;
    plVar5[10] = 0;
    plVar5[0xb] = 0;
    plVar5[8] = 0;
    plVar5[9] = 0;
    plVar5[6] = 0;
    plVar5[7] = 0;
    plVar5[4] = 0;
    plVar5[5] = 0;
    plVar5[2] = 0;
    plVar5[3] = 0;
    plVar5[0xc] = 0;
    *plVar5 = (long)local_38;
    QReadWriteLock::QReadWriteLock((QReadWriteLock *)(plVar5 + 2),0);
    *(undefined1 *)(plVar5 + 3) = 0;
    plVar5[4] = 0;
    plVar5[5] = 0;
    plVar5[6] = 0;
    plVar5[7] = 0;
    plVar5[8] = 0;
    plVar5[9] = 0;
    plVar5[10] = 0;
    *plVar5 = (long)&PTR__PromiseData_00135580;
    plVar5[0xb] = 0;
    plVar5[0xc] = 0;
    LOCK();
    *(int *)(plVar5 + 1) = (int)plVar5[1] + 1;
    UNLOCK();
    if (plVar5 != (long *)0x0) {
      LOCK();
      *(int *)(plVar5 + 1) = (int)plVar5[1] + 1;
      UNLOCK();
    }
    local_88.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_00135518;
    local_88.super__Function_base._M_functor._8_8_ = plVar5;
    local_68.super__Function_base._M_functor._8_8_ = plVar5;
    QtPromisePrivate::PromiseResolver<bool>::PromiseResolver(&resolver,(QPromise<bool> *)&local_88);
    local_88.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_00135560;
    if ((long *)local_88.super__Function_base._M_functor._8_8_ != (long *)0x0) {
      LOCK();
      plVar5 = (long *)(local_88.super__Function_base._M_functor._8_8_ + 8);
      *(int *)plVar5 = *(int *)plVar5 + -1;
      UNLOCK();
      if ((*(int *)plVar5 == 0) &&
         ((long *)local_88.super__Function_base._M_functor._8_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_88.super__Function_base._M_functor._8_8_ + 8))();
      }
    }
    if (resolver.m_d.d == (Data *)0x0) {
      resolver_1.m_d.d =
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>)
           (Data *)0x0;
LAB_001066a8:
      bVar4 = true;
      QVar7.d = (Data *)0x0;
    }
    else {
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
      UNLOCK();
      resolver_1.m_d.d =
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>)
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>)
           resolver.m_d.d;
      if (resolver.m_d.d == (Data *)0x0) goto LAB_001066a8;
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
      UNLOCK();
      bVar4 = false;
      QVar7 = resolver.m_d.d;
    }
    local_111 = (bool)(~*(byte *)((long)local_48 + lVar8) & 1);
    QtPromisePrivate::PromiseResolver<bool>::resolve<bool>
              ((PromiseResolver<bool> *)&resolver_1,&local_111);
    if (!bVar4) {
      LOCK();
      ((QVar7.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           ((QVar7.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((QVar7.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(QVar7.d,0x10);
      }
    }
    if (resolver_1.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
      UNLOCK();
      if (*(int *)resolver_1.m_d.d == 0) {
        operator_delete((void *)resolver_1.m_d.d,0x10);
      }
    }
    if (resolver.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
      UNLOCK();
      if (*(int *)resolver.m_d.d == 0) {
        operator_delete((void *)resolver.m_d.d,0x10);
      }
    }
    local_68.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_00135518;
    std::vector<QtPromise::QPromise<bool>,std::allocator<QtPromise::QPromise<bool>>>::
    emplace_back<QtPromise::QPromise<bool>>
              ((vector<QtPromise::QPromise<bool>,std::allocator<QtPromise::QPromise<bool>>> *)&d,
               (QPromise<bool> *)&local_68);
    local_68.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_00135560;
    if ((long *)local_68.super__Function_base._M_functor._8_8_ != (long *)0x0) {
      LOCK();
      plVar5 = (long *)(local_68.super__Function_base._M_functor._8_8_ + 8);
      *(int *)plVar5 = *(int *)plVar5 + -1;
      UNLOCK();
      if ((*(int *)plVar5 == 0) &&
         ((long *)local_68.super__Function_base._M_functor._8_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_68.super__Function_base._M_functor._8_8_ + 8))();
      }
    }
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0xc);
  QtPromise::all<bool,_std::vector,_std::allocator<QtPromise::QPromise<bool>_>_>
            ((QtPromise *)&d_1,
             (vector<QtPromise::QPromise<bool>,_std::allocator<QtPromise::QPromise<bool>_>_> *)&d);
  std::vector<QtPromise::QPromise<bool>,_std::allocator<QtPromise::QPromise<bool>_>_>::~vector
            ((vector<QtPromise::QPromise<bool>,_std::allocator<QtPromise::QPromise<bool>_>_> *)&d);
  pQVar2 = local_110;
  if (local_110 != (QArrayData *)0x0) {
    LOCK();
    (local_110->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_110->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001354e8;
  pPVar6 = (PromiseData<QList<int>_> *)operator_new(0x68);
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)
   &(pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData = 0;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (pPVar6->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.size = 0;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.size = 0;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.d =
       (Data *)0x0;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.d =
       (Data *)0x0;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_bool_&)>_> *)0x0;
  *(undefined8 *)&(pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_settled =
       0;
  (pPVar6->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_00135978;
  QReadWriteLock::QReadWriteLock
            (&(pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_lock,0);
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_settled = false;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.d =
       (Data *)0x0;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_bool_&)>_> *)0x0;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.size = 0;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.d =
       (Data *)0x0;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.size = 0;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseData_00135910;
  (pPVar6->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar6->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar1 = &(pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData
  ;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar6 != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &(pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<bool>::Data>)
       &PTR__QPromiseBase_001358d8;
  p.super_QPromiseBase<QList<int>_>.m_d.d = pPVar6;
  QtPromisePrivate::PromiseResolver<QList<int>_>::PromiseResolver
            (&resolver_1,(QPromise<QList<int>_> *)&resolver);
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<bool>::Data>)
       &PTR__QPromiseBase_001354e8;
  if (pPVar6 != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &(pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (pPVar6 != (PromiseData<QList<int>_> *)0x0)) {
      (*(pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase
        [1])();
    }
  }
  pPVar3 = local_90;
  if (resolver_1.m_d.d == (Data *)0x0) {
    d = (QArrayData *)0x0;
    cStack_e0.i = (int *)0x0;
    goto LAB_0010697b;
  }
  LOCK();
  *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
  UNLOCK();
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_108.d = (Data *)0x0;
LAB_00106966:
    d = (QArrayData *)resolver_1.m_d.d;
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    cStack_e0.i = (int *)local_108.d;
    if (local_108.d == (Data *)0x0) goto LAB_0010697b;
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_108 = resolver_1.m_d.d;
    if (resolver_1.m_d.d != (Data *)0x0) goto LAB_00106966;
  }
  d = (QArrayData *)resolver_1.m_d.d;
  LOCK();
  ((local_108.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
  _q_value.super___atomic_base<int>._M_i =
       ((local_108.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
       super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  cStack_e0.i = (int *)local_108.d;
LAB_0010697b:
  local_d8 = pQVar2;
  local_d0 = local_48;
  local_c8 = 3;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_88.super__Function_base._M_manager = (_Manager_type)0x0;
  local_88._M_invoker = (_Invoker_type)0x0;
  local_88.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_88.super__Function_base._M_functor._8_8_ = 0;
  local_108.d = (Data *)cStack_e0;
  local_f0 = d;
  local_88.super__Function_base._M_functor._M_unused._M_object = operator_new(0x28);
  *(QArrayData **)local_88.super__Function_base._M_functor._M_unused._0_8_ = d;
  if (d != (QArrayData *)0x0) {
    LOCK();
    (d->ref_)._q_value.super___atomic_base<int>._M_i =
         (d->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(int **)((long)local_88.super__Function_base._M_functor._M_unused._0_8_ + 8) = cStack_e0.i;
  if ((Data *)cStack_e0.i != (Data *)0x0) {
    LOCK();
    (((QSharedData *)cStack_e0.i)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)cStack_e0.i)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(QArrayData **)((long)local_88.super__Function_base._M_functor._M_unused._0_8_ + 0x10) = local_d8
  ;
  *(undefined8 **)((long)local_88.super__Function_base._M_functor._M_unused._0_8_ + 0x18) = local_d0
  ;
  *(undefined8 *)((long)local_88.super__Function_base._M_functor._M_unused._0_8_ + 0x20) = local_c8;
  if (local_d8 == (QArrayData *)0x0) {
    local_88._M_invoker =
         std::
         _Function_handler<void_(const_QList<bool>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
         ::_M_invoke;
    local_88.super__Function_base._M_manager =
         std::
         _Function_handler<void_(const_QList<bool>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
         ::_M_manager;
  }
  else {
    LOCK();
    (local_d8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_d8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_88._M_invoker =
         std::
         _Function_handler<void_(const_QList<bool>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
         ::_M_invoke;
    local_88.super__Function_base._M_manager =
         std::
         _Function_handler<void_(const_QList<bool>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
         ::_M_manager;
    if (local_d8 != (QArrayData *)0x0) {
      LOCK();
      (local_d8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_d8,4,8);
      }
    }
  }
  if ((Data *)cStack_e0.i != (Data *)0x0) {
    LOCK();
    (((QSharedData *)cStack_e0.i)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)cStack_e0.i)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QSharedData *)cStack_e0.i)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
        ._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(cStack_e0.i,0x10);
    }
  }
  if (d != (QArrayData *)0x0) {
    LOCK();
    (d->ref_)._q_value.super___atomic_base<int>._M_i =
         (d->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((d->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)>::addHandler
            (pPVar3,&local_88);
  if (local_88.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_88.super__Function_base._M_manager)
              ((_Any_data *)&local_88,(_Any_data *)&local_88,__destroy_functor);
  }
  pPVar3 = local_90;
  QtPromisePrivate::PromiseCatcher<QList<bool>,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<QList<int>>,QtPromise::QPromiseReject<QList<int>>>
            (&local_68,(PromiseCatcher<QList<bool>,decltype(nullptr),void> *)0x0,&local_f0,
             (QPromiseResolve<QList<int>_> *)&local_108,reject);
  QtPromisePrivate::PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)>::addCatcher
            (pPVar3,&local_68);
  if (local_68.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_68.super__Function_base._M_manager)
              ((_Any_data *)&local_68,(_Any_data *)&local_68,__destroy_functor);
  }
  if (local_108.d != (Data *)0x0) {
    LOCK();
    ((local_108.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          ((local_108.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)
        ((local_108.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) {
      operator_delete(local_108.d,0x10);
    }
  }
  if (local_f0 != (QArrayData *)0x0) {
    LOCK();
    (local_f0->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_f0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_f0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_f0,0x10);
    }
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_1.m_d.d == 0) {
      operator_delete((void *)resolver_1.m_d.d,0x10);
    }
  }
  pPVar3 = local_90;
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001358d8;
  bVar4 = QtPromisePrivate::PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)>::isPending
                    (local_90);
  if (!bVar4) {
    QtPromisePrivate::PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)>::dispatch(pPVar3);
  }
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,4,8);
    }
  }
  d_1 = (QArrayData *)&PTR__QPromiseBase_001356e0;
  if (local_90 != (PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)> *)0x0) {
    LOCK();
    pQVar1 = &local_90->super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (local_90 != (PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)> *)0x0)) {
      (*local_90->_vptr_PromiseDataBase[1])();
    }
  }
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,4,8);
    }
  }
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<bool>::Data>)(Data *)0x0;
  waitForValue<QList<int>>((QList<int> *)&d,&p,(QList<int> *)&resolver);
  expectedBegin.i = (int *)QArrayData::allocate(&d_1,4,8,2,KeepSize);
  pQVar2 = d_1;
  expectedBegin.i[0] = 0x2a;
  expectedBegin.i[1] = 0x2c;
  QTest::_q_compareSequence<QList<int>::const_iterator,QList<int>::const_iterator>
            (cStack_e0,(const_iterator)(cStack_e0.i + (long)local_d8),expectedBegin,
             (const_iterator)(expectedBegin.i + 2),"waitForValue(p, QVector<int>{})",
             "(QVector<int>{42, 44})",
             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_filter.cpp"
             ,0x44);
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,4,8);
    }
  }
  if (d != (QArrayData *)0x0) {
    LOCK();
    (d->ref_)._q_value.super___atomic_base<int>._M_i =
         (d->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((d->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(d,4,8);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver.m_d.d == 0) {
      QArrayData::deallocate((QArrayData *)resolver.m_d.d,4,8);
    }
  }
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001354e8;
  if (p.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &((p.super_QPromiseBase<QList<int>_>.m_d.d)->
              super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0)) {
      (*((p.super_QPromiseBase<QList<int>_>.m_d.d)->
        super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_helpers_filter::sequenceTypes()
{
    SequenceTester<QList<int>>::exec();
    SequenceTester<QVector<int>>::exec();
    SequenceTester<std::list<int>>::exec();
    SequenceTester<std::vector<int>>::exec();
}